

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

void __thiscall
re2::TestInstance::LogMatch
          (TestInstance *this,char *prefix,Engine e,StringPiece *text,StringPiece *context,
          Anchor anchor)

{
  ostream *poVar1;
  iterator pcVar2;
  iterator pcVar3;
  StringPiece SVar4;
  re2 local_2f8 [32];
  re2 local_2d8 [32];
  re2 local_2b8 [32];
  re2 local_298 [32];
  re2 local_278 [32];
  undefined1 local_258 [48];
  re2 local_228 [32];
  re2 local_208 [32];
  char *local_1e8;
  int local_1e0;
  StringPiece local_1d8 [2];
  LogMessage local_1b8;
  Anchor local_34;
  StringPiece *pSStack_30;
  Anchor anchor_local;
  StringPiece *context_local;
  StringPiece *text_local;
  char *pcStack_18;
  Engine e_local;
  char *prefix_local;
  TestInstance *this_local;
  
  local_34 = anchor;
  pSStack_30 = context;
  context_local = text;
  text_local._4_4_ = e;
  pcStack_18 = prefix;
  prefix_local = (char *)this;
  LogMessage::LogMessage
            (&local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
             ,0x239,0);
  poVar1 = LogMessage::stream(&local_1b8);
  poVar1 = std::operator<<(poVar1,pcStack_18);
  SVar4 = EngineName(text_local._4_4_);
  local_1e8 = SVar4.ptr_;
  local_1e0 = SVar4.length_;
  local_1d8[0].ptr_ = local_1e8;
  local_1d8[0].length_ = local_1e0;
  poVar1 = operator<<(poVar1,local_1d8);
  poVar1 = std::operator<<(poVar1," regexp ");
  CEscape_abi_cxx11_(local_208,this->regexp_str_);
  poVar1 = std::operator<<(poVar1,(string *)local_208);
  poVar1 = std::operator<<(poVar1," ");
  Regexp::ToString_abi_cxx11_((Regexp *)local_258);
  StringPiece::StringPiece((StringPiece *)(local_258 + 0x20),(string *)local_258);
  CEscape_abi_cxx11_(local_228,(StringPiece *)(local_258 + 0x20));
  poVar1 = std::operator<<(poVar1,(string *)local_228);
  poVar1 = std::operator<<(poVar1," text ");
  CEscape_abi_cxx11_(local_278,context_local);
  poVar1 = std::operator<<(poVar1,(string *)local_278);
  poVar1 = std::operator<<(poVar1," (");
  pcVar2 = StringPiece::begin(context_local);
  pcVar3 = StringPiece::begin(pSStack_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(long)pcVar2 - (long)pcVar3);
  poVar1 = std::operator<<(poVar1,",");
  pcVar2 = StringPiece::end(context_local);
  pcVar3 = StringPiece::begin(pSStack_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(long)pcVar2 - (long)pcVar3);
  poVar1 = std::operator<<(poVar1,") of context ");
  CEscape_abi_cxx11_(local_298,pSStack_30);
  poVar1 = std::operator<<(poVar1,(string *)local_298);
  poVar1 = std::operator<<(poVar1," (");
  FormatKind_abi_cxx11_(local_2b8,this->kind_);
  poVar1 = std::operator<<(poVar1,(string *)local_2b8);
  poVar1 = std::operator<<(poVar1,", ");
  FormatAnchor_abi_cxx11_(local_2d8,local_34);
  poVar1 = std::operator<<(poVar1,(string *)local_2d8);
  poVar1 = std::operator<<(poVar1,", ");
  FormatMode_abi_cxx11_(local_2f8,this->flags_);
  poVar1 = std::operator<<(poVar1,(string *)local_2f8);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_208);
  LogMessage::~LogMessage(&local_1b8);
  return;
}

Assistant:

void TestInstance::LogMatch(const char* prefix, Engine e,
                            const StringPiece& text, const StringPiece& context,
                            Prog::Anchor anchor) {
  LOG(INFO) << prefix
    << EngineName(e)
    << " regexp "
    << CEscape(regexp_str_)
    << " "
    << CEscape(regexp_->ToString())
    << " text "
    << CEscape(text)
    << " ("
    << text.begin() - context.begin()
    << ","
    << text.end() - context.begin()
    << ") of context "
    << CEscape(context)
    << " (" << FormatKind(kind_)
    << ", " << FormatAnchor(anchor)
    << ", " << FormatMode(flags_)
    << ")";
}